

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_initCStream_usingCDict
                 (ZSTDMT_CCtx *mtctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ZSTD_CCtx_params in_stack_fffffffffffffec8;
  undefined8 local_90 [4];
  undefined8 local_70;
  int local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 uStack_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 uStack_34;
  undefined8 uStack_2c;
  undefined8 local_24;
  undefined8 uStack_1c;
  undefined8 uStack_14;
  undefined8 uStack_c;
  undefined4 local_4;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    local_90[0] = CONCAT44((cdict->matchState).cParams.windowLog,(mtctx->params).format);
    local_90[1]._0_4_ = (cdict->matchState).cParams.chainLog;
    local_90[1]._4_4_ = (cdict->matchState).cParams.hashLog;
    local_90[2]._0_4_ = (cdict->matchState).cParams.searchLog;
    local_90[2]._4_4_ = (cdict->matchState).cParams.minMatch;
    local_90[3]._0_4_ = (cdict->matchState).cParams.targetLength;
    local_90[3]._4_4_ = (cdict->matchState).cParams.strategy;
    local_70 = fParams._0_8_;
    local_68 = fParams.noDictIDFlag;
    local_64._0_4_ = (mtctx->params).compressionLevel;
    local_64._4_4_ = (mtctx->params).forceWindow;
    uStack_5c = *(undefined8 *)&(mtctx->params).field_0x34;
    uStack_54 = *(undefined8 *)((long)&(mtctx->params).targetCBlockSize + 4);
    uStack_4c._0_4_ = (mtctx->params).attachDictPref;
    uStack_4c._4_4_ = (mtctx->params).literalCompressionMode;
    local_44 = *(undefined8 *)&(mtctx->params).nbWorkers;
    uStack_3c = *(undefined8 *)((long)&(mtctx->params).jobSize + 4);
    uStack_34._0_4_ = (mtctx->params).rsyncable;
    uStack_34._4_4_ = (mtctx->params).ldmParams.enableLdm;
    uStack_2c._0_4_ = (mtctx->params).ldmParams.hashLog;
    uStack_2c._4_4_ = (mtctx->params).ldmParams.bucketSizeLog;
    local_24._0_4_ = (mtctx->params).ldmParams.minMatchLength;
    local_24._4_4_ = (mtctx->params).ldmParams.hashRateLog;
    uStack_1c = *(undefined8 *)&(mtctx->params).ldmParams.windowLog;
    uStack_14 = *(undefined8 *)((long)&(mtctx->params).customMem.customAlloc + 4);
    uStack_c = *(undefined8 *)((long)&(mtctx->params).customMem.customFree + 4);
    local_4 = *(undefined4 *)((long)&(mtctx->params).customMem.opaque + 4);
    puVar3 = local_90;
    puVar4 = (undefined8 *)&stack0xfffffffffffffec8;
    for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + 1;
      puVar4 = puVar4 + 1;
    }
    sVar1 = ZSTDMT_initCStream_internal
                      (mtctx,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffec8,
                       pledgedSrcSize);
    return sVar1;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTDMT_initCStream_usingCDict(ZSTDMT_CCtx* mtctx,
                               const ZSTD_CDict* cdict,
                                     ZSTD_frameParameters fParams,
                                     unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;
    if (cdict==NULL) return ERROR(dictionary_wrong);   /* method incompatible with NULL cdict */
    cctxParams.cParams = ZSTD_getCParamsFromCDict(cdict);
    cctxParams.fParams = fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0 /*dictSize*/, ZSTD_dct_auto, cdict,
                                       cctxParams, pledgedSrcSize);
}